

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.h
# Opt level: O0

void __thiscall
FlowEdge::SetPathDependentInfo(FlowEdge *this,PathDependentInfo *info,JitArenaAllocator *alloc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JitArenaAllocator *pJVar4;
  PathDependentInfo *pPVar5;
  TrackAllocData local_48;
  JitArenaAllocator *local_20;
  JitArenaAllocator *alloc_local;
  PathDependentInfo *info_local;
  FlowEdge *this_local;
  
  local_20 = alloc;
  alloc_local = (JitArenaAllocator *)info;
  info_local = (PathDependentInfo *)this;
  bVar2 = PathDependentInfo::HasInfo(info);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.h"
                       ,0x21a,"(info.HasInfo())","info.HasInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pJVar4 = local_20;
  if (this->pathDependentInfo == (PathDependentInfo *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&PathDependentInfo::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.h"
               ,0x21e);
    pJVar4 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar4,&local_48);
    pPVar5 = (PathDependentInfo *)new<Memory::JitArenaAllocator>(0x18,pJVar4,0x4e98c0);
    pPVar5->leftValue =
         (Value *)(alloc_local->super_ArenaAllocator).
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                  super_Allocator.outOfMemoryFunc;
    pPVar5->rightValue =
         (Value *)(alloc_local->super_ArenaAllocator).
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                  super_Allocator.recoverMemoryFunc;
    *(BigBlock **)&pPVar5->rightConstantValue =
         (alloc_local->super_ArenaAllocator).
         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_ArenaData.
         bigBlocks;
    this->pathDependentInfo = pPVar5;
  }
  else {
    pPVar5 = this->pathDependentInfo;
    pPVar5->leftValue =
         (Value *)(alloc_local->super_ArenaAllocator).
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                  super_Allocator.outOfMemoryFunc;
    pPVar5->rightValue =
         (Value *)(alloc_local->super_ArenaAllocator).
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                  super_Allocator.recoverMemoryFunc;
    pPVar5->rightConstantValue =
         *(int32 *)&(alloc_local->super_ArenaAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    super_ArenaData.bigBlocks;
    pPVar5->relationship =
         *(PathDependentRelationship *)
          ((long)&(alloc_local->super_ArenaAllocator).
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                  super_ArenaData.bigBlocks + 4);
  }
  return;
}

Assistant:

void SetPathDependentInfo(const PathDependentInfo &info, JitArenaAllocator *const alloc)
    {
        Assert(info.HasInfo());

        if (!pathDependentInfo)
        {
            pathDependentInfo = JitAnew(alloc, PathDependentInfo, info);
        }
        else
        {
            *pathDependentInfo = info;
        }
    }